

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_world.cc
# Opt level: O2

void sptk::world::makeipt(int nw,int *ip)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int *piVar5;
  
  ip[2] = 0;
  ip[3] = 0x10;
  iVar3 = 2;
  for (; 0x20 < nw; nw = (uint)nw >> 2) {
    iVar2 = iVar3 * 2;
    lVar4 = (long)iVar3;
    piVar5 = ip + lVar4 * 2;
    for (; lVar4 < iVar2; lVar4 = lVar4 + 1) {
      iVar1 = ip[lVar4];
      *piVar5 = iVar1 * 4;
      ip[iVar2 + lVar4] = iVar3 * 0x10 + iVar1 * 4;
      piVar5 = piVar5 + 1;
    }
    iVar3 = iVar2;
  }
  return;
}

Assistant:

void makeipt(int nw, int *ip) {
  int j, l, m, m2, p, q;

  ip[2] = 0;
  ip[3] = 16;
  m = 2;
  for (l = nw; l > 32; l >>= 2) {
    m2 = m << 1;
    q = m2 << 3;
    for (j = m; j < m2; j++) {
      p = ip[j] << 2;
      ip[m + j] = p;
      ip[m2 + j] = p + q;
    }
    m = m2;
  }
}